

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O3

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC,int *stage_map,int *nstages_active)

{
  sunrealtype ***pppsVar1;
  sunrealtype ***pppsVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  
  iVar5 = -0x16;
  if ((MRIC != (MRIStepCoupling)0x0) &&
     (((pppsVar1 = MRIC->W, pppsVar1 != (sunrealtype ***)0x0 || (MRIC->G != (sunrealtype ***)0x0))
      && (nstages_active != (int *)0x0 && stage_map != (int *)0x0)))) {
    if (MRIC->type - MRISTEP_MERK < 2) {
      iVar5 = MRIC->stages;
      *nstages_active = iVar5;
      if (iVar5 < 1) {
        return 0;
      }
      iVar5 = 0;
      lVar6 = 0;
      do {
        stage_map[lVar6] = (int)lVar6;
        lVar6 = lVar6 + 1;
      } while (lVar6 < MRIC->stages);
    }
    else {
      *nstages_active = 0;
      uVar9 = (ulong)(uint)MRIC->stages;
      if (0 < MRIC->stages) {
        pppsVar2 = MRIC->G;
        lVar6 = 0;
        iVar7 = 0;
        do {
          iVar8 = (int)uVar9;
          if ((pppsVar1 == (sunrealtype ***)0x0) || ((long)MRIC->nmat < 1)) {
            bVar3 = false;
          }
          else {
            dVar11 = 0.0;
            lVar10 = 0;
            do {
              if (-1 < iVar8) {
                uVar9 = 0;
                do {
                  dVar11 = dVar11 + ABS(pppsVar1[lVar10][uVar9][lVar6]);
                  uVar9 = uVar9 + 1;
                } while (iVar8 + 1 != uVar9);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != MRIC->nmat);
            bVar3 = 2.220446049250313e-14 < dVar11;
          }
          if ((pppsVar2 == (sunrealtype ***)0x0) || ((long)MRIC->nmat < 1)) {
            bVar4 = false;
          }
          else {
            dVar11 = 0.0;
            lVar10 = 0;
            do {
              if (-1 < iVar8) {
                uVar9 = 0;
                do {
                  dVar11 = dVar11 + ABS(pppsVar2[lVar10][uVar9][lVar6]);
                  uVar9 = uVar9 + 1;
                } while (iVar8 + 1 != uVar9);
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != MRIC->nmat);
            bVar4 = 2.220446049250313e-14 < dVar11;
          }
          iVar8 = -1;
          if ((bool)(bVar3 | bVar4)) {
            iVar8 = iVar7;
          }
          iVar7 = (uint)(byte)(bVar3 | bVar4) + iVar7;
          stage_map[lVar6] = iVar8;
          lVar6 = lVar6 + 1;
          uVar9 = (ulong)MRIC->stages;
        } while (lVar6 < (long)uVar9);
        if (iVar7 != 0) {
          *nstages_active = iVar7;
          iVar5 = 0;
        }
        return iVar5;
      }
    }
  }
  return iVar5;
}

Assistant:

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC, int* stage_map,
                                int* nstages_active)
{
  int i, j, k, idx;
  sunrealtype Wsum, Gsum;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* ----------------------
   * Check for valid inputs
   * ---------------------- */

  if (!MRIC) { return (ARK_ILL_INPUT); }
  if (!(MRIC->W) && !(MRIC->G)) { return (ARK_ILL_INPUT); }
  if (!stage_map || !nstages_active) { return (ARK_ILL_INPUT); }

  /* -------------------------------------------
   * MERK and MRI-SR have "identity" storage map
   * ------------------------------------------- */

  if ((MRIC->type == MRISTEP_MERK) || (MRIC->type == MRISTEP_SR))
  {
    /* Number of stage RHS vectors active */
    *nstages_active = MRIC->stages;

    /* Create an identity map (all columns are non-zero) */
    for (j = 0; j < MRIC->stages; j++) { stage_map[j] = j; }
    return (ARK_SUCCESS);
  }

  /* ----------------------------------------
   * Compute storage map for MRI-GARK methods
   * ---------------------------------------- */

  /* Number of stage RHS vectors active */
  *nstages_active = 0;

  /* Initial storage index */
  idx = 0;

  /* Check if a stage corresponds to a column of zeros for all coupling
   * matrices by computing the column sums */
  for (j = 0; j < MRIC->stages; j++)
  {
    Wsum = ZERO;
    Gsum = ZERO;

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i <= MRIC->stages; i++)
        {
          Wsum += SUNRabs(MRIC->W[k][i][j]);
        }
      }
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i <= MRIC->stages; i++)
        {
          Gsum += SUNRabs(MRIC->G[k][i][j]);
        }
      }
    }

    if (Wsum > tol || Gsum > tol)
    {
      stage_map[j] = idx;
      idx++;
    }
    else { stage_map[j] = -1; }
  }

  /* Check and set number of stage RHS vectors active */
  if (idx < 1) { return (ARK_ILL_INPUT); }

  *nstages_active = idx;

  return (ARK_SUCCESS);
}